

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlParseSGMLCatalogPubid(xmlChar *cur,xmlChar **id)

{
  xmlChar *pxVar1;
  bool bVar2;
  int newSize;
  xmlChar *tmp;
  int local_30;
  int iStack_2c;
  xmlChar stop;
  int size;
  int len;
  xmlChar *buf;
  xmlChar **id_local;
  xmlChar *cur_local;
  
  iStack_2c = 0;
  local_30 = 0x32;
  *id = (xmlChar *)0x0;
  if (*cur == '\"') {
    id_local = (xmlChar **)(cur + 1);
    tmp._7_1_ = '\"';
  }
  else if (*cur == '\'') {
    id_local = (xmlChar **)(cur + 1);
    tmp._7_1_ = '\'';
  }
  else {
    tmp._7_1_ = ' ';
    id_local = (xmlChar **)cur;
  }
  _size = (xmlChar *)(*xmlMalloc)(0x32);
  if (_size == (xmlChar *)0x0) {
    xmlCatalogErrMemory();
    return (xmlChar *)0x0;
  }
  do {
    bVar2 = true;
    if (""[*(byte *)id_local] == '\0') {
      bVar2 = *(char *)id_local == '?';
    }
    if (((!bVar2) || ((*(char *)id_local == tmp._7_1_ && (tmp._7_1_ != ' ')))) ||
       ((tmp._7_1_ == ' ' &&
        ((*(char *)id_local == ' ' ||
         (((8 < *(byte *)id_local && (*(byte *)id_local < 0xb)) || (*(char *)id_local == '\r')))))))
       ) {
      _size[iStack_2c] = '\0';
      if (tmp._7_1_ == ' ') {
        if (((*(char *)id_local != ' ') && ((*(byte *)id_local < 9 || (10 < *(byte *)id_local)))) &&
           (*(char *)id_local != '\r')) {
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
      }
      else {
        if (*(char *)id_local != tmp._7_1_) {
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
        id_local = (xmlChar **)((long)id_local + 1);
      }
      *id = _size;
      return (xmlChar *)id_local;
    }
    pxVar1 = _size;
    if (local_30 <= iStack_2c + 1) {
      local_30 = xmlGrowCapacity(local_30,1,1,1000000000);
      if (local_30 < 0) {
        xmlCatalogErrMemory();
        (*xmlFree)(_size);
        return (xmlChar *)0x0;
      }
      pxVar1 = (xmlChar *)(*xmlRealloc)(_size,(long)local_30);
      if (pxVar1 == (xmlChar *)0x0) {
        xmlCatalogErrMemory();
        (*xmlFree)(_size);
        return (xmlChar *)0x0;
      }
    }
    _size = pxVar1;
    _size[iStack_2c] = *(xmlChar *)id_local;
    id_local = (xmlChar **)((long)id_local + 1);
    iStack_2c = iStack_2c + 1;
  } while( true );
}

Assistant:

static const xmlChar *
xmlParseSGMLCatalogPubid(const xmlChar *cur, xmlChar **id) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 50;
    xmlChar stop;

    *id = NULL;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	stop = ' ';
    }
    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    while (IS_PUBIDCHAR_CH(*cur) || (*cur == '?')) {
	if ((*cur == stop) && (stop != ' '))
	    break;
	if ((stop == ' ') && (IS_BLANK_CH(*cur)))
	    break;
	if (len + 1 >= size) {
            xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = *cur;
	NEXT;
    }
    buf[len] = 0;
    if (stop == ' ') {
	if (!IS_BLANK_CH(*cur)) {
	    xmlFree(buf);
	    return(NULL);
	}
    } else {
	if (*cur != stop) {
	    xmlFree(buf);
	    return(NULL);
	}
	NEXT;
    }
    *id = buf;
    return(cur);
}